

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corruption_test.cc
# Opt level: O2

Slice __thiscall leveldb::CorruptionTest::Key(CorruptionTest *this,int i,string *storage)

{
  Slice SVar1;
  char buf [100];
  
  snprintf(buf,100,"%016d",i);
  strlen(buf);
  std::__cxx11::string::assign((char *)storage,(ulong)buf);
  SVar1.data_ = (storage->_M_dataplus)._M_p;
  SVar1.size_ = storage->_M_string_length;
  return SVar1;
}

Assistant:

Slice Key(int i, std::string* storage) {
    char buf[100];
    std::snprintf(buf, sizeof(buf), "%016d", i);
    storage->assign(buf, strlen(buf));
    return Slice(*storage);
  }